

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  byte bVar1;
  xpath_variable_set *this_00;
  char_t *pcVar2;
  int iVar3;
  bool bVar4;
  lexeme_t lVar5;
  nodetest_t nVar6;
  xpath_lexer_string *pxVar7;
  char_t *pcVar8;
  xpath_variable *pxVar9;
  byte *pbVar10;
  xpath_parser *this_01;
  xpath_ast_node *pxVar11;
  xpath_ast_node *pxVar12;
  xpath_parse_result *pxVar13;
  char *pcVar14;
  xpath_value_type xVar15;
  anon_union_8_5_7bd254c6_for__data *paVar16;
  ast_type_t aVar17;
  xpath_lexer_string *in_RSI;
  xpath_ast_node *in_R8;
  char_t *in_R9;
  ulong uVar18;
  xpath_lexer *this_02;
  anon_union_8_5_7bd254c6_for__data *paVar19;
  xpath_ast_node *args [2];
  xpath_lexer_string local_48;
  xpath_lexer *local_38;
  
  paVar19 = (anon_union_8_5_7bd254c6_for__data *)args;
  lVar5 = (this->_lexer)._cur_lexeme;
  if (0xc < lVar5 - lex_minus) {
switchD_0017df2a_caseD_9:
    pxVar11 = parse_location_path(this);
    return pxVar11;
  }
  this_02 = &this->_lexer;
  switch(lVar5) {
  case lex_minus:
    xpath_lexer::next(this_02);
    pxVar11 = parse_expression(this,7);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11 = alloc_node(this,ast_op_negate,xpath_type_number,pxVar11,(xpath_ast_node *)0x0);
    return pxVar11;
  default:
    goto switchD_0017df2a_caseD_9;
  case lex_var_ref:
    goto switchD_0017df2a_caseD_b;
  case lex_open_brace:
    goto switchD_0017df2a_caseD_c;
  case lex_quoted_string:
  case lex_number:
    break;
  case lex_string:
    pbVar10 = (byte *)this_02->_cur;
    do {
      bVar1 = *pbVar10;
      pbVar10 = pbVar10 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
    if (bVar1 != 0x28) goto switchD_0017df2a_caseD_9;
    this_01 = (xpath_parser *)xpath_lexer::contents(this_02);
    nVar6 = parse_node_test_type(this_01,in_RSI);
    if (nVar6 != nodetest_none) goto switchD_0017df2a_caseD_9;
    lVar5 = (this->_lexer)._cur_lexeme;
  }
  switch(lVar5) {
  case lex_var_ref:
switchD_0017df2a_caseD_b:
    pxVar7 = xpath_lexer::contents(this_02);
    this_00 = this->_variables;
    if (this_00 == (xpath_variable_set *)0x0) {
      pxVar13 = this->_result;
      pcVar14 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar2 = pxVar7->begin;
      uVar18 = (long)pxVar7->end - (long)pcVar2;
      pcVar8 = this->_scratch;
      local_38 = this_02;
      if ((0x1f < uVar18) &&
         (pcVar8 = (char_t *)
                   (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(uVar18 + 1), pcVar8 == (char_t *)0x0)) goto LAB_0017e2ff;
      memcpy(pcVar8,pcVar2,uVar18);
      pcVar8[uVar18] = '\0';
      pxVar9 = xpath_variable_set::_find(this_00,pcVar8);
      if (pcVar8 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar8);
      }
      this_02 = local_38;
      if (pxVar9 != (xpath_variable *)0x0) {
        xpath_lexer::next(local_38);
        xVar15 = pxVar9->_type;
        pxVar11 = (xpath_ast_node *)alloc_node(this);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar11->_type = '\x14';
        pxVar11->_rettype = (char)xVar15;
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
        goto LAB_0017e130;
      }
      pxVar13 = this->_result;
      pcVar14 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
switchD_0017df2a_caseD_c:
    xpath_lexer::next(this_02);
    pxVar11 = parse_expression(this,0);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    if ((this->_lexer)._cur_lexeme == lex_close_brace) {
      xpath_lexer::next(this_02);
      goto LAB_0017e1f7;
    }
    pxVar13 = this->_result;
    pcVar14 = "Expected \')\' to match an opening \'(\'";
    break;
  default:
    pxVar13 = this->_result;
    pcVar14 = "Unrecognizable primary expression";
    break;
  case lex_quoted_string:
    pxVar7 = xpath_lexer::contents(this_02);
    pxVar9 = (xpath_variable *)alloc_string(this,pxVar7);
    if (pxVar9 == (xpath_variable *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    xpath_lexer::next(this_02);
    pxVar11 = (xpath_ast_node *)alloc_node(this);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x12';
    pxVar11->_rettype = '\x03';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
LAB_0017e130:
    pxVar11->_left = (xpath_ast_node *)0x0;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    (pxVar11->_data).variable = pxVar9;
    goto LAB_0017e1f7;
  case lex_number:
    pxVar7 = xpath_lexer::contents(this_02);
    pcVar2 = pxVar7->begin;
    pxVar7 = xpath_lexer::contents(this_02);
    uVar18 = (long)pxVar7->end - (long)pcVar2;
    pcVar8 = this->_scratch;
    if ((0x1f < uVar18) &&
       (pcVar8 = (char_t *)
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(uVar18 + 1), pcVar8 == (char_t *)0x0)) {
LAB_0017e2ff:
      error_oom(this);
      return (xpath_ast_node *)0x0;
    }
    memcpy(pcVar8,pcVar2,uVar18);
    pcVar8[uVar18] = '\0';
    local_38 = (xpath_lexer *)convert_string_to_number(pcVar8);
    if (pcVar8 != this->_scratch) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pcVar8);
    }
    xpath_lexer::next(this_02);
    pxVar11 = (xpath_ast_node *)alloc_node(this);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x13';
    pxVar11->_rettype = '\x02';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
    pxVar11->_left = (xpath_ast_node *)0x0;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    (pxVar11->_data).number = (double)local_38;
LAB_0017e1f7:
    while (lVar5 = (this->_lexer)._cur_lexeme, lVar5 == lex_open_square_brace) {
      xpath_lexer::next(this_02);
      if (pxVar11->_rettype != '\x01') {
        pxVar13 = this->_result;
        pcVar14 = "Predicate has to be applied to node set";
        goto LAB_0017e384;
      }
      pxVar12 = parse_expression(this,0);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11 = alloc_node(this,ast_filter,pxVar11,pxVar12,(predicate_t)in_R8);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
        pxVar13 = this->_result;
        pcVar14 = "Expected \']\' to match an opening \'[\'";
        goto LAB_0017e384;
      }
      xpath_lexer::next(this_02);
    }
    if ((lVar5 & ~lex_equal) != lex_slash) {
      return pxVar11;
    }
    xpath_lexer::next(this_02);
    if (lVar5 != lex_double_slash) {
LAB_0017e353:
      pxVar11 = parse_relative_location_path(this,pxVar11);
      return pxVar11;
    }
    if (pxVar11->_rettype == '\x01') {
      pxVar11 = alloc_node(this,(ast_type_t)pxVar11,(xpath_ast_node *)0x5,axis_attribute,
                           nodetest_none,in_R9);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      goto LAB_0017e353;
    }
    pxVar13 = this->_result;
    pcVar14 = "Step has to be applied to node set";
    break;
  case lex_string:
    args[0] = (xpath_ast_node *)0x0;
    args[1] = (xpath_ast_node *)0x0;
    pxVar7 = xpath_lexer::contents(this_02);
    local_48.begin = pxVar7->begin;
    local_48.end = pxVar7->end;
    xpath_lexer::next(this_02);
    if ((this->_lexer)._cur_lexeme == lex_open_brace) {
      xpath_lexer::next(this_02);
      uVar18 = 0;
      pcVar14 = "No comma between function arguments";
      pxVar11 = (xpath_ast_node *)0x0;
      while (lVar5 = (this->_lexer)._cur_lexeme, lVar5 != lex_close_brace) {
        if (uVar18 != 0) {
          if (lVar5 != lex_comma) goto switchD_0017e3f5_caseD_64;
          xpath_lexer::next(this_02);
        }
        pxVar12 = parse_expression(this,0);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        paVar16 = (anon_union_8_5_7bd254c6_for__data *)&pxVar11->_next;
        if (uVar18 < 2) {
          paVar16 = paVar19;
        }
        paVar16->variable = (xpath_variable *)pxVar12;
        uVar18 = uVar18 + 1;
        paVar19 = paVar19 + 1;
        pxVar11 = pxVar12;
      }
      xpath_lexer::next(this_02);
      pcVar14 = "Unrecognized function or wrong parameter count";
      switch(*local_48.begin) {
      case 'b':
        bVar4 = xpath_lexer_string::operator==(&local_48,"boolean");
        if ((uVar18 == 1) && (bVar4)) {
          aVar17 = ast_func_boolean;
LAB_0017e83b:
          xVar15 = xpath_type_boolean;
          pxVar11 = args[0];
LAB_0017e842:
          in_R8 = (xpath_ast_node *)0x0;
LAB_0017e845:
          pxVar11 = alloc_node(this,aVar17,xVar15,pxVar11,in_R8);
          goto LAB_0017e84d;
        }
        break;
      case 'c':
        bVar4 = xpath_lexer_string::operator==(&local_48,"count");
        if ((uVar18 == 1) && (bVar4)) {
          if (args[0]->_rettype != '\x01') goto LAB_0017e99b;
          aVar17 = ast_func_count;
LAB_0017e722:
          xVar15 = xpath_type_number;
          pxVar11 = args[0];
          goto LAB_0017e842;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"contains");
        if ((uVar18 == 2) && (bVar4)) {
          aVar17 = ast_func_contains;
LAB_0017e80a:
          xVar15 = xpath_type_boolean;
          pxVar11 = args[0];
          in_R8 = args[1];
          goto LAB_0017e845;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"concat");
        if ((1 < uVar18) && (bVar4)) {
          aVar17 = ast_func_concat;
          goto LAB_0017e8b0;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"ceiling");
        if ((uVar18 == 1) && (bVar4)) {
          aVar17 = ast_func_ceiling;
          goto LAB_0017e722;
        }
        break;
      case 'f':
        bVar4 = xpath_lexer_string::operator==(&local_48,"false");
        if ((uVar18 == 0) && (bVar4)) {
          aVar17 = ast_func_false;
LAB_0017e6e3:
          xVar15 = xpath_type_boolean;
LAB_0017e6e6:
          pxVar11 = (xpath_ast_node *)0x0;
          goto LAB_0017e842;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"floor");
        if ((uVar18 == 1) && (bVar4)) {
          aVar17 = ast_func_floor;
          goto LAB_0017e722;
        }
        break;
      case 'i':
        bVar4 = xpath_lexer_string::operator==(&local_48,"id");
        if ((uVar18 == 1) && (bVar4)) {
          aVar17 = ast_func_id;
          xVar15 = xpath_type_node_set;
          pxVar11 = args[0];
          goto LAB_0017e842;
        }
        break;
      case 'l':
        bVar4 = xpath_lexer_string::operator==(&local_48,"last");
        if ((uVar18 == 0) && (bVar4)) {
          aVar17 = ast_func_last;
LAB_0017e57c:
          xVar15 = xpath_type_number;
          goto LAB_0017e6e6;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"lang");
        if ((uVar18 == 1) && (bVar4)) {
          aVar17 = ast_func_lang;
          goto LAB_0017e83b;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"local-name");
        if ((uVar18 < 2) && (bVar4)) {
          if ((uVar18 != 1) || (args[0]->_rettype == '\x01')) {
            iVar3 = 0x1a;
            goto LAB_0017e7d4;
          }
          goto LAB_0017e99b;
        }
        break;
      case 'n':
        bVar4 = xpath_lexer_string::operator==(&local_48,"name");
        if ((uVar18 < 2) && (bVar4)) {
          if ((uVar18 != 1) || (args[0]->_rettype == '\x01')) {
            iVar3 = 0x1e;
LAB_0017e7d4:
            aVar17 = iVar3 - (uint)(uVar18 == 0);
            goto LAB_0017e7d8;
          }
        }
        else {
          bVar4 = xpath_lexer_string::operator==(&local_48,"namespace-uri");
          if ((1 < uVar18) || (!bVar4)) {
            bVar4 = xpath_lexer_string::operator==(&local_48,"normalize-space");
            if ((uVar18 < 2) && (bVar4)) {
              aVar17 = ast_func_normalize_space_1 - (uVar18 == 0);
              goto LAB_0017e8b0;
            }
            bVar4 = xpath_lexer_string::operator==(&local_48,"not");
            if ((uVar18 == 1) && (bVar4)) {
              aVar17 = ast_func_not;
              goto LAB_0017e83b;
            }
            bVar4 = xpath_lexer_string::operator==(&local_48,"number");
            if ((uVar18 < 2) && (bVar4)) {
              iVar3 = 0x33;
              goto LAB_0017e71a;
            }
            break;
          }
          if ((uVar18 != 1) || (args[0]->_rettype == '\x01')) {
            iVar3 = 0x1c;
            goto LAB_0017e7d4;
          }
        }
LAB_0017e99b:
        pcVar14 = "Function has to be applied to node set";
        break;
      case 'p':
        bVar4 = xpath_lexer_string::operator==(&local_48,"position");
        if ((uVar18 == 0) && (bVar4)) {
          aVar17 = ast_func_position;
          goto LAB_0017e57c;
        }
        break;
      case 'r':
        bVar4 = xpath_lexer_string::operator==(&local_48,"round");
        if ((uVar18 == 1) && (bVar4)) {
          aVar17 = ast_func_round;
          goto LAB_0017e722;
        }
        break;
      case 's':
        bVar4 = xpath_lexer_string::operator==(&local_48,"string");
        if ((uVar18 < 2) && (bVar4)) {
          aVar17 = ast_func_string_1 - (uVar18 == 0);
LAB_0017e7d8:
          xVar15 = xpath_type_string;
          pxVar11 = args[0];
          goto LAB_0017e842;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"string-length");
        if ((uVar18 < 2) && (bVar4)) {
          iVar3 = 0x29;
LAB_0017e71a:
          aVar17 = iVar3 - (uint)(uVar18 == 0);
          goto LAB_0017e722;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"starts-with");
        if ((uVar18 == 2) && (bVar4)) {
          aVar17 = ast_func_starts_with;
          goto LAB_0017e80a;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"substring-before");
        if ((uVar18 == 2) && (bVar4)) {
          aVar17 = ast_func_substring_before;
          goto LAB_0017e8b0;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"substring-after");
        if ((uVar18 == 2) && (bVar4)) {
          aVar17 = ast_func_substring_after;
LAB_0017e94a:
          xVar15 = xpath_type_string;
          in_R8 = args[1];
        }
        else {
          bVar4 = xpath_lexer_string::operator==(&local_48,"substring");
          if (((uVar18 & 0xfffffffffffffffe) == 2) && (bVar4)) {
            aVar17 = uVar18 == 2 ^ ast_func_substring_3;
            goto LAB_0017e94a;
          }
          bVar4 = xpath_lexer_string::operator==(&local_48,"sum");
          if ((uVar18 != 1) || (!bVar4)) break;
          if (args[0]->_rettype != '\x01') goto LAB_0017e99b;
          aVar17 = ast_func_sum;
          xVar15 = xpath_type_number;
          in_R8 = (xpath_ast_node *)0x0;
        }
        pxVar11 = alloc_node(this,aVar17,xVar15,args[0],in_R8);
LAB_0017e84d:
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        goto LAB_0017e1f7;
      case 't':
        bVar4 = xpath_lexer_string::operator==(&local_48,"translate");
        if ((uVar18 == 3) && (bVar4)) {
          aVar17 = ast_func_translate;
LAB_0017e8b0:
          xVar15 = xpath_type_string;
          pxVar11 = args[0];
          in_R8 = args[1];
          goto LAB_0017e845;
        }
        bVar4 = xpath_lexer_string::operator==(&local_48,"true");
        if ((uVar18 == 0) && (bVar4)) {
          aVar17 = ast_func_true;
          goto LAB_0017e6e3;
        }
      }
    }
    else {
      pcVar14 = "Unrecognized function call";
    }
switchD_0017e3f5_caseD_64:
    pxVar13 = this->_result;
    pxVar13->error = pcVar14;
    goto LAB_0017e387;
  }
LAB_0017e384:
  pxVar13->error = pcVar14;
LAB_0017e387:
  pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI__IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}